

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsingleshottimer.cpp
# Opt level: O0

void __thiscall
QSingleShotTimer::startTimerForReceiver
          (QSingleShotTimer *this,Duration interval,TimerType timerType,QObject *receiver)

{
  long lVar1;
  duration<long,_std::ratio<1L,_1000000000L>_> remaining;
  QThread *pQVar2;
  QObjectPrivate *pQVar3;
  QDeadlineTimer *deadline;
  long in_RCX;
  int in_EDX;
  StartTimerEvent *in_RDI;
  long in_FS_OFFSET;
  Duration in_stack_00000028;
  QObjectPrivate *d_ptr;
  QDeadlineTimer *in_stack_ffffffffffffff78;
  QObject *in_stack_ffffffffffffff80;
  TimerType in_stack_ffffffffffffff9c;
  QBasicTimer *in_stack_ffffffffffffffa0;
  StartTimerEvent *event;
  QObject *in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RCX != 0) {
    event = in_RDI;
    remaining.__r = (rep)QObject::thread((QObject *)0x426b0f);
    pQVar2 = QObject::thread((QObject *)0x426b1e);
    if ((QThread *)remaining.__r != pQVar2) {
      pQVar3 = QObjectPrivate::get((QObject *)0x426b39);
      *(uint *)&(pQVar3->super_QObjectData).field_0x30 =
           *(uint *)&(pQVar3->super_QObjectData).field_0x30 & 0xffffffef;
      QObject::setParent(in_stack_ffffffffffffff80,(QObject *)in_stack_ffffffffffffff78);
      pQVar2 = QObject::thread((QObject *)0x426b64);
      QObject::moveToThread((QObject *)in_RDI,pQVar2);
      deadline = (QDeadlineTimer *)operator_new(0x30);
      QDeadlineTimer::QDeadlineTimer<long,std::ratio<1l,1000000000l>>
                (in_stack_ffffffffffffff78,remaining,PreciseTimer);
      StartTimerEvent::StartTimerEvent(in_RDI,(QSingleShotTimer *)remaining.__r,deadline);
      QCoreApplication::postEvent(in_stack_ffffffffffffffd0,(QEvent *)event,in_EDX);
      goto LAB_00426c0f;
    }
  }
  QBasicTimer::start(in_stack_ffffffffffffffa0,in_stack_00000028,in_stack_ffffffffffffff9c,
                     (QObject *)in_RDI);
LAB_00426c0f:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSingleShotTimer::startTimerForReceiver(Duration interval, Qt::TimerType timerType,
                                             const QObject *receiver)
{
    if (receiver && receiver->thread() != thread()) {
        QObjectPrivate *d_ptr = QObjectPrivate::get(this);
        d_ptr->sendChildEvents = false;

        setParent(nullptr);
        moveToThread(receiver->thread());

        QCoreApplication::postEvent(this,
                                    new StartTimerEvent(this, QDeadlineTimer(interval, timerType)));
        // the event owns "this" and is handled concurrently, so unsafe to
        // access "this" beyond this point
    } else {
        timer.start(interval, timerType, this);
    }
}